

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NamePattern.cpp
# Opt level: O0

double Tld_Dga_Eval_C_A(size_t len,uint8_t *val)

{
  size_t sVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double kl;
  double p;
  int j;
  uint8_t char_group_index;
  size_t i;
  double klt;
  size_t count [5];
  uint8_t *val_local;
  size_t len_local;
  
  i = 0;
  memset(&klt,0,0x28);
  for (_j = 0; _j < len; _j = _j + 1) {
    count[(ulong)char_group[(int)(val[_j] - 10)] - 1] =
         count[(ulong)char_group[(int)(val[_j] - 10)] - 1] + 1;
  }
  for (p._0_4_ = 0; p._0_4_ < 5; p._0_4_ = p._0_4_ + 1) {
    sVar1 = count[(long)p._0_4_ + -1];
    auVar5._8_4_ = (int)(sVar1 >> 0x20);
    auVar5._0_8_ = sVar1;
    auVar5._12_4_ = 0x45300000;
    lVar2 = len + 1;
    auVar6._8_4_ = (int)((ulong)lVar2 >> 0x20);
    auVar6._0_8_ = lVar2;
    auVar6._12_4_ = 0x45300000;
    dVar3 = ((auVar5._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0) +
            (double)char_group_weight[p._0_4_] / 26.0) /
            ((auVar6._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0));
    dVar4 = log(dVar3 / char_group_proba[p._0_4_]);
    i = (size_t)(dVar3 * dVar4 + (double)i);
  }
  return (double)i;
}

Assistant:

static double Tld_Dga_Eval_C_A(size_t len, uint8_t * val)
{
    size_t count[5];
    double klt = 0;

    memset(count, 0, sizeof(count));

    for (size_t i = 0; i<len; i++)
    {
        uint8_t char_group_index = char_group[val[i] - 10];
        count[char_group_index] ++;
    }

    for (int j = 0; j < 5; j++)
    {
        double p = ((double)count[j] + (double)char_group_weight[j] / 26.0) / ((double)(len + 1));
        double kl = p * log(p / char_group_proba[j]);
        klt += kl;
    }

    return klt;
}